

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_hash.c
# Opt level: O0

void * qc_hashtbl_enumnext(QcHashTbl *hashtbl)

{
  void *pvVar1;
  void *data;
  QcHashTbl *hashtbl_local;
  
  while( true ) {
    if (hashtbl->cur_entry != (HashEntry *)0x0) {
      pvVar1 = hashtbl->cur_entry->data;
      hashtbl->cur_entry = hashtbl->cur_entry->next;
      return pvVar1;
    }
    hashtbl->cur_bucket_no = hashtbl->cur_bucket_no + 1;
    if (hashtbl->bucket_count <= hashtbl->cur_bucket_no) break;
    hashtbl->cur_entry = hashtbl->pp_bucket[hashtbl->cur_bucket_no];
  }
  return (void *)0x0;
}

Assistant:

void* qc_hashtbl_enumnext(QcHashTbl *hashtbl)
{
    void *data;

	while(NULL == hashtbl->cur_entry)
	{
		hashtbl->cur_bucket_no += 1;
		if(hashtbl->cur_bucket_no >= hashtbl->bucket_count)
		{
			return NULL;
		}
		hashtbl->cur_entry = hashtbl->pp_bucket[hashtbl->cur_bucket_no];
	}

	data = hashtbl->cur_entry->data;

    hashtbl->cur_entry = hashtbl->cur_entry->next;

    return data;
}